

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cProgramInterfaceQueryTests.cpp
# Opt level: O1

long __thiscall gl4cts::anon_unknown_0::SimpleShaders::Run(SimpleShaders *this)

{
  CallLogWrapper *this_00;
  GLenum *pGVar1;
  undefined8 src_vs;
  GLuint program;
  long error;
  GLenum props2 [12];
  GLint expected2 [12];
  GLint expected [11];
  GLenum props [11];
  
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x16])(props2,this);
  src_vs = props2._0_8_;
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x17])(expected2,this);
  program = PIQBase::CreateProgram
                      (&this->super_PIQBase,(char *)src_vs,(char *)expected2._0_8_,false);
  if ((GLint *)expected2._0_8_ != expected2 + 4) {
    operator_delete((void *)expected2._0_8_,expected2._16_8_ + 1);
  }
  pGVar1 = props2 + 4;
  if ((GLenum *)props2._0_8_ != pGVar1) {
    operator_delete((void *)props2._0_8_,props2._16_8_ + 1);
  }
  this_00 = &(this->super_PIQBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glBindAttribLocation(this_00,program,0,"position");
  glu::CallLogWrapper::glBindFragDataLocation(this_00,program,0,"color");
  PIQBase::LinkProgram(&this->super_PIQBase,program);
  error = 0;
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xd])
            (this,(ulong)program,0x92e3,0x92f5,1,&error);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xd])
            (this,(ulong)program,0x92e3,0x92f6,9,&error);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xd])
            (this,(ulong)program,0x92e4,0x92f5,1,&error);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xd])
            (this,(ulong)program,0x92e4,0x92f6,6,&error);
  props2._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props2,"color","");
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xe])
            (this,(ulong)program,0x92e4,props2,0,&error);
  if ((GLenum *)props2._0_8_ != pGVar1) {
    operator_delete((void *)props2._0_8_,props2._16_8_ + 1);
  }
  props2._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props2,"position","");
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xe])
            (this,(ulong)program,0x92e3,props2,0,&error);
  if ((GLenum *)props2._0_8_ != pGVar1) {
    operator_delete((void *)props2._0_8_,props2._16_8_ + 1);
  }
  props2._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props2,"color","");
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x10])
            (this,(ulong)program,0x92e4,0,props2,&error);
  if ((GLenum *)props2._0_8_ != pGVar1) {
    operator_delete((void *)props2._0_8_,props2._16_8_ + 1);
  }
  props2._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props2,"position","");
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x10])
            (this,(ulong)program,0x92e3,0,props2,&error);
  if ((GLenum *)props2._0_8_ != pGVar1) {
    operator_delete((void *)props2._0_8_,props2._16_8_ + 1);
  }
  props2._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props2,"position","");
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x11])
            (this,(ulong)program,0x92e3,props2,0,&error);
  if ((GLenum *)props2._0_8_ != pGVar1) {
    operator_delete((void *)props2._0_8_,props2._16_8_ + 1);
  }
  props2._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props2,"color","");
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x11])
            (this,(ulong)program,0x92e4,props2,0,&error);
  if ((GLenum *)props2._0_8_ != pGVar1) {
    operator_delete((void *)props2._0_8_,props2._16_8_ + 1);
  }
  props2._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props2,"color","");
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x14])
            (this,(ulong)program,0x92e4,props2,0,&error);
  if ((GLenum *)props2._0_8_ != pGVar1) {
    operator_delete((void *)props2._0_8_,props2._16_8_ + 1);
  }
  props[8] = 0x9306;
  props[9] = 0x930e;
  props[10] = 0x92e7;
  props[4] = 0x930a;
  props[5] = 0x9309;
  props[6] = 0x9307;
  props[7] = 0x9308;
  props[0] = 0x92f9;
  props[1] = 0x92fa;
  props[2] = 0x92fb;
  props[3] = 0x930b;
  expected[9] = 0;
  expected[10] = 0;
  expected[4] = 0;
  expected[5] = 0;
  expected[6] = 0;
  expected[7] = 0;
  expected[0] = 9;
  expected[1] = 0x8b52;
  expected[2] = 1;
  expected[3] = 0;
  expected[8] = 1;
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x13])
            (this,(ulong)program,0x92e3,0,0xb,props,0xb,expected,&error);
  props2[8] = 0x9306;
  props2[9] = 0x930e;
  props2[10] = 0x92e7;
  props2[0xb] = 0x930f;
  props2[4] = 0x930a;
  props2[5] = 0x9309;
  props2[6] = 0x9307;
  props2[7] = 0x9308;
  props2[0] = 0x92f9;
  props2[1] = 0x92fa;
  props2[2] = 0x92fb;
  props2[3] = 0x930b;
  expected2[6] = 0;
  expected2[7] = 0;
  expected2[8] = 0;
  expected2[9] = 0;
  expected2[10] = 0;
  expected2[0xb] = 0;
  expected2[0] = 6;
  expected2[1] = 0x8b52;
  expected2[2] = 1;
  expected2[3] = 0;
  expected2[4] = 1;
  expected2[5] = 0;
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x13])
            (this,(ulong)program,0x92e4,0,0xc,props2,0xc,expected2,&error);
  glu::CallLogWrapper::glDeleteProgram(this_00,program);
  return error;
}

Assistant:

virtual long Run()
	{
		GLuint program = CreateProgram(VertexShader().c_str(), FragmentShader().c_str(), false);
		glBindAttribLocation(program, 0, "position");
		glBindFragDataLocation(program, 0, "color");
		LinkProgram(program);

		long error = NO_ERROR;

		VerifyGetProgramInterfaceiv(program, GL_PROGRAM_INPUT, GL_ACTIVE_RESOURCES, 1, error);
		VerifyGetProgramInterfaceiv(program, GL_PROGRAM_INPUT, GL_MAX_NAME_LENGTH, 9, error);
		VerifyGetProgramInterfaceiv(program, GL_PROGRAM_OUTPUT, GL_ACTIVE_RESOURCES, 1, error);
		VerifyGetProgramInterfaceiv(program, GL_PROGRAM_OUTPUT, GL_MAX_NAME_LENGTH, 6, error);

		VerifyGetProgramResourceIndex(program, GL_PROGRAM_OUTPUT, "color", 0, error);
		VerifyGetProgramResourceIndex(program, GL_PROGRAM_INPUT, "position", 0, error);

		VerifyGetProgramResourceName(program, GL_PROGRAM_OUTPUT, 0, "color", error);
		VerifyGetProgramResourceName(program, GL_PROGRAM_INPUT, 0, "position", error);

		VerifyGetProgramResourceLocation(program, GL_PROGRAM_INPUT, "position", 0, error);
		VerifyGetProgramResourceLocation(program, GL_PROGRAM_OUTPUT, "color", 0, error);

		VerifyGetProgramResourceLocationIndex(program, GL_PROGRAM_OUTPUT, "color", 0, error);

		GLenum props[] = { GL_NAME_LENGTH,
						   GL_TYPE,
						   GL_ARRAY_SIZE,
						   GL_REFERENCED_BY_COMPUTE_SHADER,
						   GL_REFERENCED_BY_FRAGMENT_SHADER,
						   GL_REFERENCED_BY_GEOMETRY_SHADER,
						   GL_REFERENCED_BY_TESS_CONTROL_SHADER,
						   GL_REFERENCED_BY_TESS_EVALUATION_SHADER,
						   GL_REFERENCED_BY_VERTEX_SHADER,
						   GL_LOCATION,
						   GL_IS_PER_PATCH };
		GLint expected[] = { 9, GL_FLOAT_VEC4, 1, 0, 0, 0, 0, 0, 1, 0, 0 };
		VerifyGetProgramResourceiv(program, GL_PROGRAM_INPUT, 0, 11, props, 11, expected, error);

		GLenum props2[] = { GL_NAME_LENGTH,
							GL_TYPE,
							GL_ARRAY_SIZE,
							GL_REFERENCED_BY_COMPUTE_SHADER,
							GL_REFERENCED_BY_FRAGMENT_SHADER,
							GL_REFERENCED_BY_GEOMETRY_SHADER,
							GL_REFERENCED_BY_TESS_CONTROL_SHADER,
							GL_REFERENCED_BY_TESS_EVALUATION_SHADER,
							GL_REFERENCED_BY_VERTEX_SHADER,
							GL_LOCATION,
							GL_IS_PER_PATCH,
							GL_LOCATION_INDEX };
		GLint expected2[] = { 6, GL_FLOAT_VEC4, 1, 0, 1, 0, 0, 0, 0, 0, 0, 0 };
		VerifyGetProgramResourceiv(program, GL_PROGRAM_OUTPUT, 0, 12, props2, 12, expected2, error);

		glDeleteProgram(program);
		return error;
	}